

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

ImFont * __thiscall
ImFontAtlas::AddFontFromMemoryCompressedTTF
          (ImFontAtlas *this,void *compressed_ttf_data,int compressed_ttf_size,float size_pixels,
          ImFontConfig *font_cfg_template,ImWchar *glyph_ranges)

{
  ImFontConfig *pIVar1;
  int iVar2;
  float fVar3;
  int iVar4;
  float fVar5;
  undefined8 uVar6;
  byte bVar7;
  ImFontConfig *pIVar8;
  long lVar9;
  ImFont *pIVar10;
  ushort uVar11;
  uint uVar12;
  ImFontConfig *pIVar13;
  ImFontConfig *pIVar14;
  ulong uVar15;
  ImFontConfig *__dest;
  ImFontConfig *pIVar16;
  ImFontConfig *pIVar17;
  ImFontConfig *pIVar18;
  byte *pbVar19;
  byte *pbVar20;
  uint uVar21;
  undefined2 local_130;
  undefined1 local_12e;
  undefined2 local_12c;
  undefined1 local_12a;
  undefined3 local_118;
  undefined5 uStack_115;
  undefined3 uStack_110;
  float fStack_10d;
  float fStack_109;
  char local_e8 [48];
  ImFontConfig local_b8;
  
  uVar12 = *(uint *)((long)compressed_ttf_data + 8);
  uVar21 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
  pIVar13 = font_cfg_template;
  pIVar16 = (ImFontConfig *)glyph_ranges;
  pIVar8 = (ImFontConfig *)ImGui::MemAlloc((ulong)uVar21);
  local_b8._124_4_ = SUB84(pIVar13,0);
  local_b8._52_4_ = SUB84(pIVar16,0);
  uVar12 = *compressed_ttf_data;
  if (((uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18) ==
       0x57bc0000) &&
     (uVar12 = *(uint *)((long)compressed_ttf_data + 4),
     ((uVar12 >> 0x18 == 0 && (uVar12 & 0xff0000) == 0) && (uVar12 & 0xff00) == 0) &&
     (uVar12 & 0xff) == 0)) {
    uVar12 = *(uint *)((long)compressed_ttf_data + 8);
    uVar15 = (ulong)(uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                    uVar12 << 0x18);
    pIVar1 = (ImFontConfig *)(pIVar8->Name + (uVar15 - 0x54));
    pIVar17 = (ImFontConfig *)(pIVar8->Name + (uVar15 - 0x53));
    __dest = pIVar8;
    pbVar19 = (byte *)((long)compressed_ttf_data + 0x10);
    stb__barrier_in_b = (uchar *)compressed_ttf_data;
    stb__barrier_out_e = (uchar *)pIVar1;
    stb__barrier_out_b = (uchar *)pIVar8;
    stb__dout = (uchar *)pIVar8;
    do {
      local_b8._124_4_ = SUB84(pIVar13,0);
      local_b8._52_4_ = SUB84(pIVar16,0);
      bVar7 = *pbVar19;
      uVar12 = (uint)bVar7;
      if (bVar7 < 0x20) {
        if (bVar7 < 0x18) {
          if (bVar7 < 0x10) {
            if (bVar7 < 8) {
              if (bVar7 == 4) {
                uVar11 = *(ushort *)(pbVar19 + 4) << 8 | *(ushort *)(pbVar19 + 4) >> 8;
                pIVar14 = (ImFontConfig *)(__dest->Name + ((ulong)uVar11 - 0x53));
                if ((ImFontConfig *)(__dest->Name + ((ulong)uVar11 - 0x53)) <= pIVar1) {
                  pIVar16 = (ImFontConfig *)((ulong)pbVar19[2] * 0x100);
                  pIVar13 = (ImFontConfig *)(ulong)pbVar19[3];
                  pIVar14 = pIVar17;
                  if (pIVar8 <= (ImFontConfig *)
                                (__dest->Name +
                                (~((ulong)((ulong)pbVar19[1] * 0x10000 + (long)pIVar13) |
                                  (ulong)pIVar16) - 0x54))) {
                    iVar2 = uVar11 + 1;
                    pIVar13 = (ImFontConfig *)
                              (~(ulong)((long)pIVar13 + (long)pIVar16) +
                              (ulong)pbVar19[1] * -0x10000);
                    do {
                      pIVar14 = (ImFontConfig *)((long)&__dest->FontData + 1);
                      *(uchar *)&__dest->FontData = *(uchar *)((long)__dest + (long)pIVar13);
                      iVar2 = iVar2 + -1;
                      __dest = pIVar14;
                    } while (iVar2 != 0);
                  }
                }
                pbVar20 = pbVar19 + 6;
                stb__dout = (uchar *)pIVar14;
              }
              else {
                if (uVar12 != 6) {
                  if (uVar12 == 7) {
                    uVar15 = (ulong)(ushort)(*(ushort *)(pbVar19 + 1) << 8 |
                                            *(ushort *)(pbVar19 + 1) >> 8);
                    pIVar18 = (ImFontConfig *)(__dest->Name + (uVar15 - 0x53));
                    pIVar14 = pIVar18;
                    if ((pIVar18 <= pIVar1) &&
                       (pIVar14 = pIVar17, compressed_ttf_data <= pbVar19 + 3)) {
                      memcpy(__dest,pbVar19 + 3,uVar15 + 1);
                      uVar15 = (ulong)(ushort)(*(ushort *)(pbVar19 + 1) << 8 |
                                              *(ushort *)(pbVar19 + 1) >> 8);
                      pIVar14 = pIVar18;
                    }
                    lVar9 = 4;
                    stb__dout = (uchar *)pIVar14;
                    goto LAB_001315b2;
                  }
                  break;
                }
                pIVar14 = (ImFontConfig *)(__dest->Name + ((ulong)pbVar19[4] - 0x53));
                if ((ImFontConfig *)(__dest->Name + ((ulong)pbVar19[4] - 0x53)) <= pIVar1) {
                  pIVar16 = (ImFontConfig *)((ulong)pbVar19[2] * 0x100);
                  pIVar13 = (ImFontConfig *)(ulong)pbVar19[3];
                  pIVar14 = pIVar17;
                  if (pIVar8 <= (ImFontConfig *)
                                (__dest->Name +
                                (~((ulong)((ulong)pbVar19[1] * 0x10000 + (long)pIVar13) |
                                  (ulong)pIVar16) - 0x54))) {
                    uVar15 = (ulong)pbVar19[4] + 1;
                    pIVar13 = (ImFontConfig *)
                              (~(ulong)((long)pIVar13 + (long)pIVar16) +
                              (ulong)pbVar19[1] * -0x10000);
                    do {
                      pIVar14 = (ImFontConfig *)((long)&__dest->FontData + 1);
                      *(uchar *)&__dest->FontData = *(uchar *)((long)__dest + (long)pIVar13);
                      uVar12 = (int)uVar15 - 1;
                      uVar15 = (ulong)uVar12;
                      __dest = pIVar14;
                    } while (uVar12 != 0);
                  }
                }
                pbVar20 = pbVar19 + 5;
                stb__dout = (uchar *)pIVar14;
              }
            }
            else {
              pIVar13 = (ImFontConfig *)(ulong)pbVar19[1];
              uVar15 = (ulong)((uVar12 * 0x100 + (uint)pbVar19[1]) - 0x7ff);
              pIVar14 = (ImFontConfig *)(__dest->Name + (uVar15 - 0x54));
              pIVar16 = pIVar14;
              if ((pIVar14 <= pIVar1) && (pIVar16 = pIVar17, compressed_ttf_data <= pbVar19 + 2)) {
                memcpy(__dest,pbVar19 + 2,uVar15);
                bVar7 = *pbVar19;
                pIVar13 = (ImFontConfig *)CONCAT71((int7)((ulong)pIVar13 >> 8),pbVar19[1]);
                pIVar16 = pIVar14;
              }
              uVar15 = (ulong)pIVar13 & 0xff | (ulong)bVar7 << 8;
              lVar9 = -0x7fd;
              stb__dout = (uchar *)pIVar16;
LAB_001315b2:
              local_b8._124_4_ = SUB84(pIVar13,0);
              local_b8._52_4_ = SUB84(pIVar16,0);
              pbVar20 = pbVar19 + uVar15 + lVar9;
              pIVar14 = (ImFontConfig *)stb__dout;
              if (pbVar20 == pbVar19) break;
            }
          }
          else {
            uVar11 = *(ushort *)(pbVar19 + 3) << 8 | *(ushort *)(pbVar19 + 3) >> 8;
            pIVar13 = (ImFontConfig *)(ulong)uVar11;
            pIVar14 = (ImFontConfig *)(pIVar13->Name + -0x53 + (long)(__dest->Name + -0x54));
            if (((ImFontConfig *)(pIVar13->Name + -0x53 + (long)(__dest->Name + -0x54)) <= pIVar1)
               && (uVar15 = (ulong)(((uint)pbVar19[1] * 0x100 +
                                    ((uint)pbVar19[2] | (uint)bVar7 << 0x10)) - 0xfffff),
                  pIVar14 = pIVar17, pIVar8 <= (ImFontConfig *)((long)__dest - uVar15))) {
              pIVar13 = (ImFontConfig *)(ulong)(uVar11 + 1);
              do {
                pIVar14 = (ImFontConfig *)((long)&__dest->FontData + 1);
                *(uchar *)&__dest->FontData = *(uchar *)((long)__dest - uVar15);
                uVar12 = (int)pIVar13 - 1;
                pIVar13 = (ImFontConfig *)(ulong)uVar12;
                __dest = pIVar14;
              } while (uVar12 != 0);
            }
            pbVar20 = pbVar19 + 5;
            stb__dout = (uchar *)pIVar14;
          }
        }
        else {
          pIVar13 = (ImFontConfig *)(ulong)pbVar19[3];
          pIVar14 = (ImFontConfig *)(__dest->Name + -0x53 + (long)(pIVar13->Name + -0x54));
          if (((ImFontConfig *)(__dest->Name + -0x53 + (long)(pIVar13->Name + -0x54)) <= pIVar1) &&
             (uVar15 = (ulong)(((uint)pbVar19[1] * 0x100 + ((uint)pbVar19[2] | (uint)bVar7 << 0x10))
                              - 0x17ffff), pIVar14 = pIVar17,
             pIVar8 <= (ImFontConfig *)((long)__dest - uVar15))) {
            pIVar13 = (ImFontConfig *)((long)&pIVar13->FontData + 1);
            do {
              pIVar14 = (ImFontConfig *)((long)&__dest->FontData + 1);
              *(uchar *)&__dest->FontData = *(uchar *)((long)__dest - uVar15);
              uVar12 = (int)pIVar13 - 1;
              pIVar13 = (ImFontConfig *)(ulong)uVar12;
              __dest = pIVar14;
            } while (uVar12 != 0);
          }
          pbVar20 = pbVar19 + 4;
          stb__dout = (uchar *)pIVar14;
        }
      }
      else if ((char)bVar7 < '\0') {
        uVar12 = uVar12 - 0x7f;
        uVar15 = (ulong)uVar12;
        pIVar14 = (ImFontConfig *)(__dest->Name + (uVar15 - 0x54));
        pIVar18 = pIVar14;
        if ((pIVar14 <= pIVar1) &&
           (pIVar13 = (ImFontConfig *)~(ulong)pbVar19[1], pIVar14 = pIVar17, pIVar18 = pIVar17,
           pIVar8 <= (ImFontConfig *)
                     ((long)(((ImFontConfig *)
                             (((ImFontConfig *)(__dest->Name + -0x54))->Name + -0x54))->Name + -0x54
                            ) +
                     (long)((ImFontConfig *)
                           (((ImFontConfig *)
                            (((ImFontConfig *)(pIVar13->Name + -0x54))->Name + -0x54))->Name + -0x54
                           ))->Name + 0xffffffffffffffacU))) {
          while (pIVar14 = __dest, pIVar18 = (ImFontConfig *)stb__dout, uVar12 != 0) {
            stb__dout = (uchar *)((long)&__dest->FontData + 1);
            *(uchar *)&__dest->FontData =
                 *(uchar *)((long)(((ImFontConfig *)
                                   (((ImFontConfig *)(pIVar13->Name + -0x54))->Name + -0x54))->Name
                                  + -0x54) +
                           (long)((ImFontConfig *)
                                 (((ImFontConfig *)
                                  (((ImFontConfig *)(__dest->Name + -0x54))->Name + -0x54))->Name +
                                 -0x54))->Name + 0xffffffffffffffacU);
            uVar12 = (int)uVar15 - 1;
            uVar15 = (ulong)uVar12;
            __dest = (ImFontConfig *)stb__dout;
          }
        }
        stb__dout = (uchar *)pIVar18;
        pbVar20 = pbVar19 + 2;
      }
      else {
        if (bVar7 < 0x40) {
          pIVar14 = (ImFontConfig *)(__dest->Name + ((ulong)(uVar12 - 0x1f) - 0x54));
          pIVar13 = pIVar14;
          if ((pIVar14 <= pIVar1) && (pIVar13 = pIVar17, compressed_ttf_data <= pbVar19 + 1)) {
            memcpy(__dest,pbVar19 + 1,(ulong)(uVar12 - 0x1f));
            bVar7 = *pbVar19;
            pIVar13 = pIVar14;
          }
          uVar15 = (ulong)bVar7;
          lVar9 = -0x1e;
          stb__dout = (uchar *)pIVar13;
          goto LAB_001315b2;
        }
        pIVar13 = (ImFontConfig *)(ulong)pbVar19[2];
        pIVar14 = (ImFontConfig *)(__dest->Name + -0x53 + (long)(pIVar13->Name + -0x54));
        if (((ImFontConfig *)(__dest->Name + -0x53 + (long)(pIVar13->Name + -0x54)) <= pIVar1) &&
           (uVar15 = (ulong)(((uint)bVar7 * 0x100 + (uint)pbVar19[1]) - 0x3fff), pIVar14 = pIVar17,
           pIVar8 <= (ImFontConfig *)((long)__dest - uVar15))) {
          pIVar13 = (ImFontConfig *)((long)&pIVar13->FontData + 1);
          do {
            pIVar14 = (ImFontConfig *)((long)&__dest->FontData + 1);
            *(uchar *)&__dest->FontData = *(uchar *)((long)__dest - uVar15);
            uVar12 = (int)pIVar13 - 1;
            pIVar13 = (ImFontConfig *)(ulong)uVar12;
            __dest = pIVar14;
          } while (uVar12 != 0);
        }
        pbVar20 = pbVar19 + 3;
        stb__dout = (uchar *)pIVar14;
      }
      local_b8._124_4_ = SUB84(pIVar13,0);
      local_b8._52_4_ = SUB84(pIVar16,0);
      __dest = pIVar14;
      pbVar19 = pbVar20;
    } while (pIVar14 <= pIVar1);
  }
  if (font_cfg_template == (ImFontConfig *)0x0) {
    uStack_115 = 0;
    uStack_110 = 0;
    fStack_10d = 0.0;
    fStack_109 = 0.0;
    local_e8[0] = '\0';
    local_e8[1] = '\0';
    local_e8[2] = '\0';
    local_e8[3] = '\0';
    local_e8[4] = '\0';
    local_e8[5] = '\0';
    local_e8[6] = '\0';
    local_e8[7] = '\0';
    local_e8[8] = '\0';
    local_e8[9] = '\0';
    local_e8[10] = '\0';
    local_e8[0xb] = '\0';
    local_e8[0xc] = '\0';
    local_e8[0xd] = '\0';
    local_e8[0xe] = '\0';
    local_e8[0xf] = '\0';
    local_e8[0x10] = '\0';
    local_e8[0x11] = '\0';
    local_e8[0x12] = '\0';
    local_e8[0x13] = '\0';
    local_e8[0x14] = '\0';
    local_e8[0x15] = '\0';
    local_e8[0x16] = '\0';
    local_e8[0x17] = '\0';
    local_e8[0x18] = '\0';
    local_e8[0x19] = '\0';
    local_e8[0x1a] = '\0';
    local_e8[0x1b] = '\0';
    local_e8[0x1c] = '\0';
    local_e8[0x1d] = '\0';
    local_e8[0x1e] = '\0';
    local_e8[0x1f] = '\0';
    local_e8[0x20] = '\0';
    local_e8[0x21] = '\0';
    local_e8[0x22] = '\0';
    local_e8[0x23] = '\0';
    local_e8[0x24] = '\0';
    local_e8[0x25] = '\0';
    local_e8[0x26] = '\0';
    local_e8[0x27] = '\0';
    iVar2 = 3;
    iVar4 = 1;
    fVar3 = 0.0;
    fVar5 = 3.4028235e+38;
    local_b8.DstFont = (ImFont *)0x0;
    local_b8.RasterizerMultiply = 1.0;
    local_b8.RasterizerFlags = 0;
    local_b8.MergeMode = false;
    local_b8.GlyphRanges = (ImWchar *)0x0;
    local_b8.PixelSnapH = false;
    local_b8.FontNo = 0;
  }
  else {
    local_12a = font_cfg_template->field_0xf;
    local_12c = *(undefined2 *)&font_cfg_template->field_0xd;
    local_b8.FontNo = font_cfg_template->FontNo;
    iVar2 = font_cfg_template->OversampleH;
    iVar4 = font_cfg_template->OversampleV;
    local_b8.PixelSnapH = font_cfg_template->PixelSnapH;
    uVar6 = *(undefined8 *)((long)&(font_cfg_template->GlyphExtraSpacing).y + 1);
    local_118 = (undefined3)*(undefined8 *)&font_cfg_template->field_0x21;
    uStack_115 = (undefined5)((ulong)*(undefined8 *)&font_cfg_template->field_0x21 >> 0x18);
    uStack_110 = (undefined3)uVar6;
    fStack_10d = (float)((ulong)uVar6 >> 0x18);
    fStack_109._1_3_ = (undefined3)((uint)(font_cfg_template->GlyphOffset).y >> 8);
    fStack_109._0_1_ = (undefined1)((ulong)uVar6 >> 0x38);
    local_b8._52_4_ = *(undefined4 *)&font_cfg_template->field_0x34;
    local_b8.GlyphRanges = font_cfg_template->GlyphRanges;
    fVar3 = font_cfg_template->GlyphMinAdvanceX;
    fVar5 = font_cfg_template->GlyphMaxAdvanceX;
    local_b8.MergeMode = font_cfg_template->MergeMode;
    local_12e = font_cfg_template->field_0x4b;
    local_130 = *(undefined2 *)&font_cfg_template->field_0x49;
    local_b8.RasterizerFlags = font_cfg_template->RasterizerFlags;
    local_b8.RasterizerMultiply = font_cfg_template->RasterizerMultiply;
    local_e8._32_8_ = *(undefined8 *)(font_cfg_template->Name + 0x20);
    local_e8._16_8_ = *(undefined8 *)(font_cfg_template->Name + 0x10);
    local_e8._24_8_ = *(undefined8 *)(font_cfg_template->Name + 0x18);
    local_e8._0_8_ = *(undefined8 *)font_cfg_template->Name;
    local_e8._8_8_ = *(undefined8 *)(font_cfg_template->Name + 8);
    local_b8._124_4_ = *(undefined4 *)&font_cfg_template->field_0x7c;
    local_b8.DstFont = font_cfg_template->DstFont;
  }
  local_b8.FontDataOwnedByAtlas = true;
  local_b8._13_2_ = local_12c;
  local_b8._15_1_ = local_12a;
  local_b8.OversampleV = iVar4;
  local_b8.OversampleH = iVar2;
  local_b8.GlyphExtraSpacing._0_5_ = uStack_115;
  local_b8._33_3_ = local_118;
  local_b8.GlyphOffset.x = fStack_10d;
  local_b8.GlyphExtraSpacing.y._1_3_ = uStack_110;
  local_b8.GlyphOffset.y = fStack_109;
  local_b8.GlyphMaxAdvanceX = fVar5;
  local_b8.GlyphMinAdvanceX = fVar3;
  local_b8._73_2_ = local_130;
  local_b8._75_1_ = local_12e;
  local_b8.Name[0] = local_e8[0];
  local_b8.Name[1] = local_e8[1];
  local_b8.Name[2] = local_e8[2];
  local_b8.Name[3] = local_e8[3];
  local_b8.Name[4] = local_e8[4];
  local_b8.Name[5] = local_e8[5];
  local_b8.Name[6] = local_e8[6];
  local_b8.Name[7] = local_e8[7];
  local_b8.Name[8] = local_e8[8];
  local_b8.Name[9] = local_e8[9];
  local_b8.Name[10] = local_e8[10];
  local_b8.Name[0xb] = local_e8[0xb];
  local_b8.Name[0xc] = local_e8[0xc];
  local_b8.Name[0xd] = local_e8[0xd];
  local_b8.Name[0xe] = local_e8[0xe];
  local_b8.Name[0xf] = local_e8[0xf];
  local_b8.Name[0x10] = local_e8[0x10];
  local_b8.Name[0x11] = local_e8[0x11];
  local_b8.Name[0x12] = local_e8[0x12];
  local_b8.Name[0x13] = local_e8[0x13];
  local_b8.Name[0x14] = local_e8[0x14];
  local_b8.Name[0x15] = local_e8[0x15];
  local_b8.Name[0x16] = local_e8[0x16];
  local_b8.Name[0x17] = local_e8[0x17];
  local_b8.Name[0x18] = local_e8[0x18];
  local_b8.Name[0x19] = local_e8[0x19];
  local_b8.Name[0x1a] = local_e8[0x1a];
  local_b8.Name[0x1b] = local_e8[0x1b];
  local_b8.Name[0x1c] = local_e8[0x1c];
  local_b8.Name[0x1d] = local_e8[0x1d];
  local_b8.Name[0x1e] = local_e8[0x1e];
  local_b8.Name[0x1f] = local_e8[0x1f];
  local_b8.Name[0x20] = local_e8[0x20];
  local_b8.Name[0x21] = local_e8[0x21];
  local_b8.Name[0x22] = local_e8[0x22];
  local_b8.Name[0x23] = local_e8[0x23];
  local_b8.Name[0x24] = local_e8[0x24];
  local_b8.Name[0x25] = local_e8[0x25];
  local_b8.Name[0x26] = local_e8[0x26];
  local_b8.Name[0x27] = local_e8[0x27];
  if (glyph_ranges != (ImWchar *)0x0) {
    local_b8.GlyphRanges = glyph_ranges;
  }
  local_b8.FontData = pIVar8;
  local_b8.FontDataSize = uVar21;
  local_b8.SizePixels = size_pixels;
  pIVar10 = AddFont(this,&local_b8);
  return pIVar10;
}

Assistant:

ImFont* ImFontAtlas::AddFontFromMemoryCompressedTTF(const void* compressed_ttf_data, int compressed_ttf_size, float size_pixels, const ImFontConfig* font_cfg_template, const ImWchar* glyph_ranges)
{
    const unsigned int buf_decompressed_size = stb_decompress_length((const unsigned char*)compressed_ttf_data);
    unsigned char* buf_decompressed_data = (unsigned char *)ImGui::MemAlloc(buf_decompressed_size);
    stb_decompress(buf_decompressed_data, (const unsigned char*)compressed_ttf_data, (unsigned int)compressed_ttf_size);

    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    IM_ASSERT(font_cfg.FontData == NULL);
    font_cfg.FontDataOwnedByAtlas = true;
    return AddFontFromMemoryTTF(buf_decompressed_data, (int)buf_decompressed_size, size_pixels, &font_cfg, glyph_ranges);
}